

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O1

string * __thiscall
deqp::gles2::Functional::FboConfig::getName_abi_cxx11_
          (string *__return_storage_ptr__,FboConfig *this)

{
  GLenum GVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  GVar1 = this->colorbufferType;
  if ((int)GVar1 < 0x8513) {
    if (GVar1 == 0) goto LAB_003ecc33;
    if (GVar1 == 0xde1) goto LAB_003ecc17;
  }
  else if ((GVar1 == 0x8513) || (GVar1 == 0x8d41)) {
LAB_003ecc17:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  getFormatName(this->colorbufferFormat);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_003ecc33:
  if (this->depthbufferType != 0) {
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    getFormatName(this->depthbufferFormat);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (this->stencilbufferType != 0) {
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    getFormatName(this->stencilbufferFormat);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FboConfig::getName (void) const
{
	std::string name = "";

	if (colorbufferType != GL_NONE)
	{
		switch (colorbufferType)
		{
			case GL_TEXTURE_2D:			name += "tex2d_";	break;
			case GL_TEXTURE_CUBE_MAP:	name += "texcube_";	break;
			case GL_RENDERBUFFER:		name += "rbo_";		break;
			default:					DE_ASSERT(false);	break;
		}
		name += getFormatName(colorbufferFormat);
	}

	if (depthbufferType != GL_NONE)
	{
		DE_ASSERT(depthbufferType == GL_RENDERBUFFER);
		if (name.length() > 0)
			name += "_";
		name += getFormatName(depthbufferFormat);
	}

	if (stencilbufferType != GL_NONE)
	{
		DE_ASSERT(stencilbufferType == GL_RENDERBUFFER);
		if (name.length() > 0)
			name += "_";
		name += getFormatName(stencilbufferFormat);
	}

	return name;
}